

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O3

RPCHelpMan * wallet::listtransactions(void)

{
  size_type *psVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  RPCHelpMan *in_RDI;
  undefined8 uVar12;
  long lVar13;
  RPCResult *arg;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_ffffffffffffeae8;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffeaec;
  undefined8 in_stack_ffffffffffffeaf8;
  undefined8 in_stack_ffffffffffffeb00;
  undefined8 in_stack_ffffffffffffeb08;
  code *pcVar15;
  undefined8 in_stack_ffffffffffffeb10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffeb18;
  pointer in_stack_ffffffffffffeb28;
  pointer pRVar16;
  pointer in_stack_ffffffffffffeb30;
  pointer pRVar17;
  pointer in_stack_ffffffffffffeb38;
  pointer pRVar18;
  RPCResult *in_stack_ffffffffffffeb40;
  RPCResult *pRVar19;
  RPCResult *in_stack_ffffffffffffeb48;
  RPCResult *pRVar20;
  pointer in_stack_ffffffffffffeb50;
  RPCResult *in_stack_ffffffffffffeb58;
  RPCResult *pRVar21;
  RPCResult *in_stack_ffffffffffffeb60;
  RPCResult *pRVar22;
  pointer in_stack_ffffffffffffeb68;
  undefined8 in_stack_ffffffffffffeb70;
  pointer in_stack_ffffffffffffeb78;
  pointer in_stack_ffffffffffffeb80;
  pointer in_stack_ffffffffffffeb88;
  undefined8 in_stack_ffffffffffffeb90;
  pointer in_stack_ffffffffffffeb98;
  pointer in_stack_ffffffffffffeba0;
  pointer in_stack_ffffffffffffeba8;
  undefined8 in_stack_ffffffffffffebb0;
  pointer in_stack_ffffffffffffebb8;
  pointer in_stack_ffffffffffffebc0;
  pointer in_stack_ffffffffffffebc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1428;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1408;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1368;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1350;
  RPCResults local_1338;
  allocator_type local_1319;
  int local_1318 [2];
  vector<RPCArg,_std::allocator<RPCArg>_> local_1310;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  string local_1278;
  string local_1258;
  string local_1238;
  string local_1218;
  string local_11f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  ulong *local_1158;
  undefined8 local_1150;
  ulong local_1148;
  undefined8 uStack_1140;
  ulong *local_1138;
  size_type local_1130;
  ulong local_1128;
  undefined8 uStack_1120;
  long *local_1118 [2];
  long local_1108 [2];
  long *local_10f8 [2];
  long local_10e8 [2];
  RPCResult local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  size_type *local_1030;
  size_type local_1028;
  size_type local_1020;
  undefined8 uStack_1018;
  long *local_1010 [2];
  long local_1000 [2];
  long *local_ff0 [2];
  long local_fe0 [2];
  long *local_fd0 [2];
  long local_fc0 [2];
  long *local_fb0 [2];
  long local_fa0 [2];
  long *local_f90 [2];
  long local_f80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  size_type *local_f50;
  size_type local_f48;
  size_type local_f40;
  undefined8 uStack_f38;
  long *local_f30 [2];
  long local_f20 [2];
  long *local_f10 [2];
  long local_f00 [2];
  long *local_ef0 [2];
  long local_ee0 [2];
  long *local_ed0 [2];
  long local_ec0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_eb0;
  long *local_e90 [2];
  long local_e80 [2];
  pointer local_e70 [2];
  undefined1 local_e60 [152];
  RPCResult local_dc8;
  RPCResult local_d40;
  RPCResult local_cb8;
  RPCResult local_c30;
  RPCResult local_ba8;
  RPCResult local_b20;
  long *local_a98 [2];
  long local_a88 [2];
  long *local_a78 [2];
  long local_a68 [2];
  RPCResult local_a58;
  long *local_9d0 [2];
  long local_9c0 [2];
  long *local_9b0 [2];
  long local_9a0 [2];
  RPCResult local_990;
  undefined1 local_908;
  undefined1 *local_900;
  undefined8 local_8f8;
  undefined1 local_8f0;
  undefined7 uStack_8ef;
  undefined1 local_8e0 [32];
  long *local_8c0 [2];
  long local_8b0 [2];
  uint *local_8a0;
  undefined8 local_898;
  uint local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_880;
  undefined1 local_828;
  long *local_820 [2];
  long local_810 [2];
  undefined1 local_800;
  undefined1 *local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8;
  undefined7 uStack_7e7;
  undefined1 local_7d8 [32];
  long *local_7b8 [2];
  long local_7a8 [2];
  UniValue local_798;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_740;
  undefined1 local_6e8;
  long *local_6e0 [2];
  long local_6d0 [2];
  undefined1 local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined7 uStack_6a7;
  undefined1 local_698 [32];
  long *local_678 [2];
  long local_668 [2];
  UniValue local_658;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_600;
  undefined1 local_5a8;
  long *local_5a0 [2];
  long local_590 [2];
  undefined1 local_580;
  vector<RPCArg,_std::allocator<RPCArg>_> local_578;
  undefined1 auStack_560 [8];
  undefined1 local_558 [32];
  long *local_538 [2];
  long local_528 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_518;
  undefined1 local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  RPCArg local_498;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030 = (size_type *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listtransactions","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nIf a label name is provided, this will return only incoming transactions paying to addresses with the specified label.\n\nReturns up to \'count\' most recent transactions skipping the first \'from\' transactions.\n"
             ,"");
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_4b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"label|dummy","");
  local_518._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_4c0 = 0;
  local_538[0] = local_528;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,
             "If set, should be a valid label name to return only incoming transactions\nwith the specified label, or \"*\" to disable filtering and return all transactions."
             ,"");
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_580 = 0;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_558._0_8_ = (pointer)0x0;
  local_558._8_2_ = 0;
  local_558._10_6_ = 0;
  local_558._16_2_ = 0;
  local_558._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeae8;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  name.field_2._8_8_ = in_stack_ffffffffffffeb00;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeb10;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeb08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeb18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeb58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeb60;
  description_10._M_string_length = in_stack_ffffffffffffeb70;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb68;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  description_10.field_2._8_8_ = in_stack_ffffffffffffeb80;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb90;
  opts._0_8_ = in_stack_ffffffffffffeb88;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb98;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeba0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeba8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffebb0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffebb8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffebc0;
  opts._64_8_ = in_stack_ffffffffffffebc8;
  ::RPCArg::RPCArg(&local_498,name,(Type)&local_4b8,fallback,description_10,opts);
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"count","");
  local_1318[1] = 10;
  ::UniValue::UniValue<int,_int,_true>(&local_658,local_1318 + 1);
  paVar11 = &local_658.val.field_2;
  local_600._8_8_ = (long)&local_600 + 0x18;
  local_600._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_658.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p == paVar11) {
    local_600._32_8_ = local_658.val.field_2._8_8_;
  }
  else {
    local_600._8_8_ = local_658.val._M_dataplus._M_p;
  }
  local_600._16_8_ = local_658.val._M_string_length;
  local_658.val._M_string_length = 0;
  local_658.val.field_2._M_local_buf[0] = '\0';
  local_600._40_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_600._48_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_600._56_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600._64_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_600._68_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_600._72_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_600._76_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_600._80_8_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8 = 2;
  local_678[0] = local_668;
  local_658.val._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_678,"The number of transactions to return","");
  local_6b8 = &local_6a8;
  local_6c0 = 0;
  local_6b0 = 0;
  local_6a8 = 0;
  local_698._0_8_ = (pointer)0x0;
  local_698._8_2_ = 0;
  local_698._10_6_ = 0;
  local_698._16_2_ = 0;
  local_698._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeae8;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  name_00.field_2._8_8_ = in_stack_ffffffffffffeb00;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeb10;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeb08;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeb18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb28;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb30;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb40;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb48;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb50;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeb58;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeb60;
  description_11._M_string_length = in_stack_ffffffffffffeb70;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb68;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  description_11.field_2._8_8_ = in_stack_ffffffffffffeb80;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb90;
  opts_00._0_8_ = in_stack_ffffffffffffeb88;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb98;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeba0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeba8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffebb0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffebb8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffebc0;
  opts_00._64_8_ = in_stack_ffffffffffffebc8;
  ::RPCArg::RPCArg(&local_390,name_00,(Type)local_5a0,fallback_00,description_11,opts_00);
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"skip","");
  local_1318[0] = 0;
  ::UniValue::UniValue<int,_int,_true>(&local_798,local_1318);
  paVar11 = &local_798.val.field_2;
  local_740._8_8_ = (long)&local_740 + 0x18;
  local_740._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_798.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798.val._M_dataplus._M_p == paVar11) {
    local_740._32_8_ = local_798.val.field_2._8_8_;
  }
  else {
    local_740._8_8_ = local_798.val._M_dataplus._M_p;
  }
  local_740._16_8_ = local_798.val._M_string_length;
  local_798.val._M_string_length = 0;
  local_798.val.field_2._M_local_buf[0] = '\0';
  local_740._40_8_ =
       local_798.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_740._48_8_ =
       local_798.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_740._56_8_ =
       local_798.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_798.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_798.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_798.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_740._64_4_ =
       local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_740._68_4_ =
       local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_740._72_4_ =
       local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_740._76_4_ =
       local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_740._80_8_ =
       local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_798.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8 = 2;
  local_7b8[0] = local_7a8;
  local_798.val._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7b8,"The number of transactions to skip","");
  local_7f8 = &local_7e8;
  local_800 = 0;
  local_7f0 = 0;
  local_7e8 = 0;
  local_7d8._0_8_ = (pointer)0x0;
  local_7d8._8_2_ = 0;
  local_7d8._10_6_ = 0;
  local_7d8._16_2_ = 0;
  local_7d8._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeae8;
  name_01._M_string_length = (size_type)in_RDI;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  name_01.field_2._8_8_ = in_stack_ffffffffffffeb00;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeb10;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeb08;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeb18;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb28;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb30;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb38;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb40;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb48;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb50;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeb58;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeb60;
  description_12._M_string_length = in_stack_ffffffffffffeb70;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb68;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  description_12.field_2._8_8_ = in_stack_ffffffffffffeb80;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb90;
  opts_01._0_8_ = in_stack_ffffffffffffeb88;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb98;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeba0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeba8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffebb0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffebb8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffebc0;
  opts_01._64_8_ = in_stack_ffffffffffffebc8;
  ::RPCArg::RPCArg(&local_288,name_01,(Type)local_6e0,fallback_01,description_12,opts_01);
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"include_watchonly","");
  local_8a0 = &local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"true for watch-only wallets, otherwise false","");
  local_880._0_8_ = (long)&local_880 + 0x10;
  if (local_8a0 == &local_890) {
    local_880._24_4_ = uStack_888;
    local_880._28_4_ = uStack_884;
  }
  else {
    local_880._0_8_ = local_8a0;
  }
  local_880._8_8_ = local_898;
  local_898 = 0;
  local_890 = local_890 & 0xffffff00;
  local_828 = 1;
  local_8c0[0] = local_8b0;
  local_8a0 = &local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c0,
             "Include transactions to watch-only addresses (see \'importaddress\')","");
  local_900 = &local_8f0;
  local_908 = 0;
  local_8f8 = 0;
  local_8f0 = 0;
  local_8e0._0_8_ = (pointer)0x0;
  local_8e0._8_2_ = 0;
  local_8e0._10_6_ = 0;
  local_8e0._16_2_ = 0;
  local_8e0._18_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeae8;
  name_02._M_string_length = (size_type)in_RDI;
  name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  name_02.field_2._8_8_ = in_stack_ffffffffffffeb00;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeb10;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeb08;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeb18;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb28;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb30;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb38;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb40;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb48;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb50;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeb58;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeb60;
  description_13._M_string_length = in_stack_ffffffffffffeb70;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb68;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb78;
  description_13.field_2._8_8_ = in_stack_ffffffffffffeb80;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb90;
  opts_02._0_8_ = in_stack_ffffffffffffeb88;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb98;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeba0;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeba8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffebb0;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffebb8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffebc0;
  opts_02._64_8_ = in_stack_ffffffffffffebc8;
  ::RPCArg::RPCArg(&local_180,name_02,(Type)local_820,fallback_02,description_13,opts_02);
  __l._M_len = 4;
  __l._M_array = &local_498;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1310,__l,&local_1319);
  local_9b0[0] = local_9a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b0,"");
  local_9d0[0] = local_9c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"");
  local_a78[0] = local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"");
  local_a98[0] = local_a88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a98,"");
  local_e70[0] = (pointer)local_e60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e70,"involvesWatchonly","");
  local_e90[0] = local_e80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e90,
             "Only returns true if imported addresses were involved in transaction.","");
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_ffffffffffffeaec;
  auVar4._12_8_ = in_stack_ffffffffffffeaf8;
  auVar4._20_8_ = in_stack_ffffffffffffeb00;
  auVar4._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffeb10;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description.field_2 = in_stack_ffffffffffffeb18;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffeb30;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffeb28;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_e60 + 0x10),BOOL,(string)(auVar4 << 0x20),SUB81(local_e70,0),
             description,inner,true);
  local_eb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_eb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb0,"address","");
  local_ed0[0] = local_ec0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ed0,
             "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."
             ,"");
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_ffffffffffffeaec;
  auVar5._12_8_ = in_stack_ffffffffffffeaf8;
  auVar5._20_8_ = in_stack_ffffffffffffeb00;
  auVar5._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffeb10;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_00.field_2 = in_stack_ffffffffffffeb18;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb30;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb28;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult
            (&local_dc8,STR,(string)(auVar5 << 0x20),SUB81(&local_eb0,0),description_00,inner_00,
             true);
  local_ef0[0] = local_ee0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ef0,"category","");
  local_f10[0] = local_f00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f10,
             "The transaction category.\n\"send\"                  Transactions sent.\n\"receive\"               Non-coinbase transactions received.\n\"generate\"              Coinbase transactions received with more than 100 confirmations.\n\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n\"orphan\"                Orphaned coinbase transactions received."
             ,"");
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  m_key_name._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb00;
  description_01._M_string_length = in_stack_ffffffffffffeb10;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_01.field_2 = in_stack_ffffffffffffeb18;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb30;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb28;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult(&local_d40,STR,m_key_name,description_01,inner_01,SUB81(local_ef0,0));
  local_f30[0] = local_f20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f30,"amount","");
  std::operator+(&local_f70,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f70,
                      ". This is negative for the \'send\' category, and is positive\nfor all other categories"
                     );
  local_f50 = &local_f40;
  psVar1 = (size_type *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_f40 = paVar11->_M_allocated_capacity;
    uStack_f38 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f40 = paVar11->_M_allocated_capacity;
    local_f50 = psVar1;
  }
  local_f48 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffeb00;
  description_02._M_string_length = in_stack_ffffffffffffeb10;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_02.field_2 = in_stack_ffffffffffffeb18;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb30;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb28;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult
            (&local_cb8,STR_AMOUNT,m_key_name_00,description_02,inner_02,SUB81(local_f30,0));
  local_f90[0] = local_f80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f90,"label","");
  local_fb0[0] = local_fa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fb0,"A comment for the address/transaction, if any","");
  uVar14 = 0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = in_stack_ffffffffffffeaec;
  auVar6._12_8_ = in_stack_ffffffffffffeaf8;
  auVar6._20_8_ = in_stack_ffffffffffffeb00;
  auVar6._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffeb10;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_03.field_2 = in_stack_ffffffffffffeb18;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb30;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb28;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult
            (&local_c30,STR,(string)(auVar6 << 0x20),SUB81(local_f90,0),description_03,inner_03,true
            );
  local_fd0[0] = local_fc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fd0,"vout","");
  local_ff0[0] = local_fe0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ff0,"the vout value","");
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffeb00;
  description_04._M_string_length = in_stack_ffffffffffffeb10;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_04.field_2 = in_stack_ffffffffffffeb18;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb30;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb28;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult(&local_ba8,NUM,m_key_name_01,description_04,inner_04,SUB81(local_fd0,0));
  local_1010[0] = local_1000;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,"fee","");
  std::operator+(&local_1050,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1050,
                      ". This is negative and only available for the\n\'send\' category of transactions."
                     );
  local_1030 = &local_1020;
  psVar1 = (size_type *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1020 = paVar11->_M_allocated_capacity;
    uStack_1018 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_1020 = paVar11->_M_allocated_capacity;
    local_1030 = psVar1;
  }
  local_1028 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  uVar14 = 0;
  auVar7._4_8_ = in_RDI;
  auVar7._0_4_ = in_stack_ffffffffffffeaec;
  auVar7._12_8_ = in_stack_ffffffffffffeaf8;
  auVar7._20_8_ = in_stack_ffffffffffffeb00;
  auVar7._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffeb10;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_05.field_2 = in_stack_ffffffffffffeb18;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb30;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb28;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb38;
  ::RPCResult::RPCResult
            (&local_b20,STR_AMOUNT,(string)(auVar7 << 0x20),SUB81(local_1010,0),description_05,
             inner_05,true);
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)(local_e60 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_13a8,__l_00,(allocator_type *)&stack0xffffffffffffeb77);
  TransactionDescriptionString();
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_13a8,
             ((long)in_stack_ffffffffffffeb60 - (long)in_stack_ffffffffffffeb58 >> 3) *
             -0xf0f0f0f0f0f0f0f +
             ((long)local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  pRVar21 = in_stack_ffffffffffffeb58;
  pRVar22 = in_stack_ffffffffffffeb60;
  if (in_stack_ffffffffffffeb58 != in_stack_ffffffffffffeb60) {
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_13a8,in_stack_ffffffffffffeb58);
      in_stack_ffffffffffffeb58 = in_stack_ffffffffffffeb58 + 1;
    } while (in_stack_ffffffffffffeb58 != in_stack_ffffffffffffeb60);
  }
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10f8[0] = local_10e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10f8,"abandoned","");
  local_1118[0] = local_1108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1118,
             "\'true\' if the transaction has been abandoned (inputs are respendable).","");
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffeb00;
  description_06._M_string_length = in_stack_ffffffffffffeb10;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_06.field_2 = in_stack_ffffffffffffeb18;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult(&local_10d8,BOOL,m_key_name_02,description_06,inner_06,SUB81(local_10f8,0))
  ;
  __l_01._M_len = 1;
  __l_01._M_array = &local_10d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb40,__l_01,
             (allocator_type *)&stack0xffffffffffffeb27);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_1388,
             ((long)in_stack_ffffffffffffeb48 - (long)in_stack_ffffffffffffeb40 >> 3) *
             -0xf0f0f0f0f0f0f0f +
             ((long)local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  pRVar19 = in_stack_ffffffffffffeb40;
  pRVar20 = in_stack_ffffffffffffeb48;
  if (in_stack_ffffffffffffeb40 != in_stack_ffffffffffffeb48) {
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_1388,in_stack_ffffffffffffeb40);
      in_stack_ffffffffffffeb40 = in_stack_ffffffffffffeb40 + 1;
    } while (in_stack_ffffffffffffeb40 != in_stack_ffffffffffffeb48);
  }
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffeb00;
  description_07._M_string_length = in_stack_ffffffffffffeb10;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_07.field_2 = in_stack_ffffffffffffeb18;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar17;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar16;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar18;
  ::RPCResult::RPCResult(&local_a58,OBJ,m_key_name_03,description_07,inner_07,SUB81(local_a78,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_a58;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1350,__l_02,(allocator_type *)&stack0xffffffffffffeb26);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeaec;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffeaf8;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffeb00;
  description_08._M_string_length = in_stack_ffffffffffffeb10;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb08;
  description_08.field_2 = in_stack_ffffffffffffeb18;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar17;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar16;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar18;
  ::RPCResult::RPCResult(&local_990,ARR,m_key_name_04,description_08,inner_08,SUB81(local_9b0,0));
  result._4_4_ = in_stack_ffffffffffffeaec;
  result.m_type = uVar14;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffeaf8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb00;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb08;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb10;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffeb18;
  result._64_8_ = pRVar16;
  result.m_description._M_dataplus._M_p = (pointer)pRVar17;
  result.m_description._M_string_length = (size_type)pRVar18;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar19;
  result.m_description.field_2._8_8_ = pRVar20;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb50;
  result.m_cond._M_string_length = (size_type)pRVar21;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar22;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffeb68;
  RPCResults::RPCResults(&local_1338,result);
  local_1218._M_dataplus._M_p = (pointer)&local_1218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1218,"listtransactions","");
  local_1238._M_dataplus._M_p = (pointer)&local_1238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1238,"");
  HelpExampleCli(&local_11f8,&local_1218,&local_1238);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_11f8,0,0,"\nList the most recent 10 transactions in the systems\n",0x35
                     );
  local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar11 == paVar10) {
    local_11d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_11d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_11d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_11d8._M_dataplus._M_p = (pointer)paVar11;
  }
  local_11d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_11d8,"\nList transactions 100 to 120\n");
  local_11b8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p == paVar11) {
    local_11b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_11b8.field_2._8_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 8);
    local_11b8.field_2._12_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
    local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
  }
  else {
    local_11b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_11b8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"listtransactions","");
  local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1298,"\"*\" 20 100","");
  HelpExampleCli(&local_1258,&local_1278,&local_1298);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
    uVar12 = local_11b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_1258._M_string_length + local_11b8._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
      uVar12 = local_1258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_1258._M_string_length + local_11b8._M_string_length)
    goto LAB_00612f18;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1258,0,0,local_11b8._M_dataplus._M_p,local_11b8._M_string_length);
  }
  else {
LAB_00612f18:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_11b8,local_1258._M_dataplus._M_p,local_1258._M_string_length);
  }
  local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if (paVar10 == paVar11) {
    local_1198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_1198.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_1198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_1198._M_dataplus._M_p = (pointer)paVar10;
  }
  local_1198._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1198,"\nAs a JSON-RPC call\n");
  local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar11 == paVar10) {
    local_1178.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1178.field_2._8_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 8);
    local_1178.field_2._12_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
  }
  else {
    local_1178.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1178._M_dataplus._M_p = (pointer)paVar11;
  }
  local_1178._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d8,"listtransactions","");
  local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"\"*\", 20, 100","");
  HelpExampleRpc(&local_12b8,&local_12d8,&local_12f8);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
    uVar12 = local_1178.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_12b8._M_string_length + local_1178._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
      uVar12 = local_12b8.field_2._M_allocated_capacity;
    }
    if (local_12b8._M_string_length + local_1178._M_string_length <= (ulong)uVar12) {
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_12b8,0,0,local_1178._M_dataplus._M_p,local_1178._M_string_length);
      goto LAB_006130dd;
    }
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1178,local_12b8._M_dataplus._M_p,local_12b8._M_string_length);
LAB_006130dd:
  local_1158 = &local_1148;
  puVar2 = (ulong *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar11) {
    local_1148 = paVar11->_M_allocated_capacity;
    uStack_1140 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_1148 = paVar11->_M_allocated_capacity;
    local_1158 = puVar2;
  }
  local_1130 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  if (local_1158 == &local_1148) {
    uStack_1120 = uStack_1140;
    local_1138 = &local_1128;
  }
  else {
    local_1138 = local_1158;
  }
  local_1128 = local_1148;
  local_1150 = 0;
  local_1148 = local_1148 & 0xffffffffffffff00;
  pcVar15 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:486:9)>
            ::_M_manager;
  description_09._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:486:9)>
       ::_M_invoke;
  description_09._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:486:9)>
                ::_M_manager;
  description_09.field_2 = in_stack_ffffffffffffeb18;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar17;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar16;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar18;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar20;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar19;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffeb50;
  examples.m_examples._M_string_length = (size_type)pRVar22;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar21;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb68;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffeb70;
  local_1158 = &local_1148;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffeaf8)),description_09,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar15 != (code *)0x0) {
    (*pcVar15)(&stack0xffffffffffffeaf8,&stack0xffffffffffffeaf8,3);
  }
  if (local_1138 != &local_1128) {
    operator_delete(local_1138,local_1128 + 1);
  }
  if (local_1158 != &local_1148) {
    operator_delete(local_1158,local_1148 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
    operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
    operator_delete(local_12d8._M_dataplus._M_p,local_12d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
    operator_delete(local_1178._M_dataplus._M_p,local_1178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
    operator_delete(local_1198._M_dataplus._M_p,local_1198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
    operator_delete(local_1258._M_dataplus._M_p,local_1258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
    operator_delete(local_1298._M_dataplus._M_p,local_1298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
    operator_delete(local_1278._M_dataplus._M_p,local_1278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
    operator_delete(local_11b8._M_dataplus._M_p,local_11b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11d8._M_dataplus._M_p != &local_11d8.field_2) {
    operator_delete(local_11d8._M_dataplus._M_p,local_11d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f8._M_dataplus._M_p != &local_11f8.field_2) {
    operator_delete(local_11f8._M_dataplus._M_p,local_11f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1238._M_dataplus._M_p != &local_1238.field_2) {
    operator_delete(local_1238._M_dataplus._M_p,local_1238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1218._M_dataplus._M_p != &local_1218.field_2) {
    operator_delete(local_1218._M_dataplus._M_p,local_1218.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1338.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.m_cond._M_dataplus._M_p != &local_990.m_cond.field_2) {
    operator_delete(local_990.m_cond._M_dataplus._M_p,
                    local_990.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.m_description._M_dataplus._M_p != &local_990.m_description.field_2) {
    operator_delete(local_990.m_description._M_dataplus._M_p,
                    local_990.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_990.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.m_key_name._M_dataplus._M_p != &local_990.m_key_name.field_2) {
    operator_delete(local_990.m_key_name._M_dataplus._M_p,
                    local_990.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58.m_cond._M_dataplus._M_p != &local_a58.m_cond.field_2) {
    operator_delete(local_a58.m_cond._M_dataplus._M_p,
                    local_a58.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58.m_description._M_dataplus._M_p != &local_a58.m_description.field_2) {
    operator_delete(local_a58.m_description._M_dataplus._M_p,
                    local_a58.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a58.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58.m_key_name._M_dataplus._M_p != &local_a58.m_key_name.field_2) {
    operator_delete(local_a58.m_key_name._M_dataplus._M_p,
                    local_a58.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1368);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8.m_cond._M_dataplus._M_p != &local_10d8.m_cond.field_2) {
    operator_delete(local_10d8.m_cond._M_dataplus._M_p,
                    local_10d8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8.m_description._M_dataplus._M_p != &local_10d8.m_description.field_2) {
    operator_delete(local_10d8.m_description._M_dataplus._M_p,
                    local_10d8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10d8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8.m_key_name._M_dataplus._M_p != &local_10d8.m_key_name.field_2) {
    operator_delete(local_10d8.m_key_name._M_dataplus._M_p,
                    local_10d8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb28);
  if (local_1118[0] != local_1108) {
    operator_delete(local_1118[0],local_1108[0] + 1);
  }
  if (local_10f8[0] != local_10e8) {
    operator_delete(local_10f8[0],local_10e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13a8);
  lVar13 = 0x3b8;
  do {
    if ((long *)(local_e60 + lVar13) != *(long **)((long)local_e70 + lVar13)) {
      operator_delete(*(long **)((long)local_e70 + lVar13),*(long *)(local_e60 + lVar13) + 1);
    }
    if ((long *)((long)local_e80 + lVar13) != *(long **)((long)local_e90 + lVar13)) {
      operator_delete(*(long **)((long)local_e90 + lVar13),*(long *)((long)local_e80 + lVar13) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_eb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar13));
    if ((long *)((long)local_ec0 + lVar13) != *(long **)((long)local_ed0 + lVar13)) {
      operator_delete(*(long **)((long)local_ed0 + lVar13),*(long *)((long)local_ec0 + lVar13) + 1);
    }
    lVar13 = lVar13 + -0x88;
  } while (lVar13 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb78);
  if (local_1030 != &local_1020) {
    operator_delete(local_1030,local_1020 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1050._M_dataplus._M_p != &local_1050.field_2) {
    operator_delete(local_1050._M_dataplus._M_p,local_1050.field_2._M_allocated_capacity + 1);
  }
  if (local_1010[0] != local_1000) {
    operator_delete(local_1010[0],local_1000[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb98);
  if (local_ff0[0] != local_fe0) {
    operator_delete(local_ff0[0],local_fe0[0] + 1);
  }
  if (local_fd0[0] != local_fc0) {
    operator_delete(local_fd0[0],local_fc0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebb8);
  if (local_fb0[0] != local_fa0) {
    operator_delete(local_fb0[0],local_fa0[0] + 1);
  }
  if (local_f90[0] != local_f80) {
    operator_delete(local_f90[0],local_f80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1428);
  if (local_f50 != &local_f40) {
    operator_delete(local_f50,local_f40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if (local_f30[0] != local_f20) {
    operator_delete(local_f30[0],local_f20[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1408);
  if (local_f10[0] != local_f00) {
    operator_delete(local_f10[0],local_f00[0] + 1);
  }
  if (local_ef0[0] != local_ee0) {
    operator_delete(local_ef0[0],local_ee0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13e8);
  if (local_ed0[0] != local_ec0) {
    operator_delete(local_ed0[0],local_ec0[0] + 1);
  }
  if (local_eb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_eb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_eb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_eb0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13c8);
  if (local_e90[0] != local_e80) {
    operator_delete(local_e90[0],local_e80[0] + 1);
  }
  if (local_e70[0] != (pointer)local_e60) {
    operator_delete(local_e70[0],local_e60._0_8_ + 1);
  }
  if (local_a98[0] != local_a88) {
    operator_delete(local_a98[0],local_a88[0] + 1);
  }
  if (local_a78[0] != local_a68) {
    operator_delete(local_a78[0],local_a68[0] + 1);
  }
  if (local_9d0[0] != local_9c0) {
    operator_delete(local_9d0[0],local_9c0[0] + 1);
  }
  if (local_9b0[0] != local_9a0) {
    operator_delete(local_9b0[0],local_9a0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1310);
  lVar13 = 0x420;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_4b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar13));
    plVar3 = *(long **)((long)&local_518 + lVar13 + 0x40);
    plVar9 = (long *)((long)&local_518 + lVar13 + 0x50);
    if (plVar9 != plVar3) {
      operator_delete(plVar3,*plVar9 + 1);
    }
    plVar9 = (long *)((long)&local_518 + lVar13 + 0x28);
    plVar3 = *(long **)((long)&local_518 + lVar13 + 0x18);
    if (plVar9 != plVar3) {
      operator_delete(plVar3,*plVar9 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_560 + lVar13));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar13));
    if ((long *)((long)local_590 + lVar13) != *(long **)((long)local_5a0 + lVar13)) {
      operator_delete(*(long **)((long)local_5a0 + lVar13),*(long *)((long)local_590 + lVar13) + 1);
    }
    lVar13 = lVar13 + -0x108;
  } while (lVar13 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8e0);
  if (local_900 != &local_8f0) {
    operator_delete(local_900,CONCAT71(uStack_8ef,local_8f0) + 1);
  }
  if (local_8c0[0] != local_8b0) {
    operator_delete(local_8c0[0],local_8b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_880._M_first);
  if (local_8a0 != &local_890) {
    operator_delete(local_8a0,CONCAT44(uStack_88c,local_890) + 1);
  }
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7d8);
  if (local_7f8 != &local_7e8) {
    operator_delete(local_7f8,CONCAT71(uStack_7e7,local_7e8) + 1);
  }
  if (local_7b8[0] != local_7a8) {
    operator_delete(local_7b8[0],local_7a8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_740._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_798.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_798.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798.val._M_dataplus._M_p != &local_798.val.field_2) {
    operator_delete(local_798.val._M_dataplus._M_p,
                    CONCAT71(local_798.val.field_2._M_allocated_capacity._1_7_,
                             local_798.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_698);
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
  }
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_600._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_658.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p != &local_658.val.field_2) {
    operator_delete(local_658.val._M_dataplus._M_p,
                    CONCAT71(local_658.val.field_2._M_allocated_capacity._1_7_,
                             local_658.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  if (local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_518._M_first);
  if (local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_4b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_4b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_4b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listtransactions()
{
    return RPCHelpMan{"listtransactions",
                "\nIf a label name is provided, this will return only incoming transactions paying to addresses with the specified label.\n"
                "\nReturns up to 'count' most recent transactions skipping the first 'from' transactions.\n",
                {
                    {"label|dummy", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If set, should be a valid label name to return only incoming transactions\n"
                          "with the specified label, or \"*\" to disable filtering and return all transactions."},
                    {"count", RPCArg::Type::NUM, RPCArg::Default{10}, "The number of transactions to return"},
                    {"skip", RPCArg::Type::NUM, RPCArg::Default{0}, "The number of transactions to skip"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Include transactions to watch-only addresses (see 'importaddress')"},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                            {RPCResult::Type::STR, "address",  /*optional=*/true, "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."},
                            {RPCResult::Type::STR, "category", "The transaction category.\n"
                                "\"send\"                  Transactions sent.\n"
                                "\"receive\"               Non-coinbase transactions received.\n"
                                "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                "\"orphan\"                Orphaned coinbase transactions received."},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT + ". This is negative for the 'send' category, and is positive\n"
                                "for all other categories"},
                            {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                            {RPCResult::Type::NUM, "vout", "the vout value"},
                            {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                 "'send' category of transactions."},
                        },
                        TransactionDescriptionString()),
                        {
                            {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                        })},
                    }
                },
                RPCExamples{
            "\nList the most recent 10 transactions in the systems\n"
            + HelpExampleCli("listtransactions", "") +
            "\nList transactions 100 to 120\n"
            + HelpExampleCli("listtransactions", "\"*\" 20 100") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listtransactions", "\"*\", 20, 100")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    std::optional<std::string> filter_label;
    if (!request.params[0].isNull() && request.params[0].get_str() != "*") {
        filter_label.emplace(LabelFromValue(request.params[0]));
        if (filter_label.value().empty()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Label argument must be a valid label name or \"*\".");
        }
    }
    int nCount = 10;
    if (!request.params[1].isNull())
        nCount = request.params[1].getInt<int>();
    int nFrom = 0;
    if (!request.params[2].isNull())
        nFrom = request.params[2].getInt<int>();
    isminefilter filter = ISMINE_SPENDABLE;

    if (ParseIncludeWatchonly(request.params[3], *pwallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    if (nCount < 0)
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative count");
    if (nFrom < 0)
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative from");

    std::vector<UniValue> ret;
    {
        LOCK(pwallet->cs_wallet);

        const CWallet::TxItems & txOrdered = pwallet->wtxOrdered;

        // iterate backwards until we have nCount items to return:
        for (CWallet::TxItems::const_reverse_iterator it = txOrdered.rbegin(); it != txOrdered.rend(); ++it)
        {
            CWalletTx *const pwtx = (*it).second;
            ListTransactions(*pwallet, *pwtx, 0, true, ret, filter, filter_label);
            if ((int)ret.size() >= (nCount+nFrom)) break;
        }
    }

    // ret is newest to oldest

    if (nFrom > (int)ret.size())
        nFrom = ret.size();
    if ((nFrom + nCount) > (int)ret.size())
        nCount = ret.size() - nFrom;

    auto txs_rev_it{std::make_move_iterator(ret.rend())};
    UniValue result{UniValue::VARR};
    result.push_backV(txs_rev_it - nFrom - nCount, txs_rev_it - nFrom); // Return oldest to newest
    return result;
},
    };
}